

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatMatvec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pvVar2 = A->content;
  iVar1 = *(int *)((long)pvVar2 + 0x28);
  lVar3 = *(long *)((long)pvVar2 + 0x38);
  lVar4 = *(long *)((long)pvVar2 + 0x20);
  lVar5 = *(long *)((long)pvVar2 + 0x30);
  lVar8 = N_VGetArrayPointer(x);
  lVar9 = N_VGetArrayPointer(y);
  plVar6 = (long *)A->content;
  lVar11 = *plVar6;
  lVar10 = 0;
  if (0 < lVar11) {
    lVar10 = lVar11;
  }
  if (iVar1 == 0) {
    for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
      *(undefined8 *)(lVar9 + lVar11 * 8) = 0;
    }
    lVar11 = plVar6[1];
    lVar10 = 0;
    if (lVar11 < 1) {
      lVar11 = lVar10;
    }
    while (lVar12 = lVar10, lVar12 != lVar11) {
      lVar7 = *(long *)(lVar3 + 8 + lVar12 * 8);
      for (lVar13 = *(long *)(lVar3 + lVar12 * 8); lVar10 = lVar12 + 1, lVar13 < lVar7;
          lVar13 = lVar13 + 1) {
        lVar10 = *(long *)(lVar5 + lVar13 * 8);
        *(double *)(lVar9 + lVar10 * 8) =
             *(double *)(lVar4 + lVar13 * 8) * *(double *)(lVar8 + lVar12 * 8) +
             *(double *)(lVar9 + lVar10 * 8);
      }
    }
  }
  else {
    for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
      *(undefined8 *)(lVar9 + lVar11 * 8) = 0;
    }
    lVar11 = 0;
    while (lVar12 = lVar11, lVar12 != lVar10) {
      lVar7 = *(long *)(lVar3 + 8 + lVar12 * 8);
      for (lVar13 = *(long *)(lVar3 + lVar12 * 8); lVar11 = lVar12 + 1, lVar13 < lVar7;
          lVar13 = lVar13 + 1) {
        *(double *)(lVar9 + lVar12 * 8) =
             *(double *)(lVar4 + lVar13 * 8) *
             *(double *)(lVar8 + *(long *)(lVar5 + lVar13 * 8) * 8) +
             *(double *)(lVar9 + lVar12 * 8);
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    SUNCheckCall(Matvec_SparseCSC(A, x, y));
  }
  else { SUNCheckCall(Matvec_SparseCSR(A, x, y)); }

  return SUN_SUCCESS;
}